

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeMemSetAtomicAccessAttributeExp
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,void *ptr,size_t size,
          ze_memory_atomic_attr_exp_flags_t attr)

{
  ze_pfnMemSetAtomicAccessAttributeExp_t pfnSetAtomicAccessAttributeExp;
  ze_result_t result;
  ze_memory_atomic_attr_exp_flags_t attr_local;
  size_t size_local;
  void *ptr_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  pfnSetAtomicAccessAttributeExp._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c558 != (code *)0x0) {
    pfnSetAtomicAccessAttributeExp._0_4_ = (*DAT_0011c558)(hContext,hDevice,ptr,size,attr);
  }
  return (ze_result_t)pfnSetAtomicAccessAttributeExp;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemSetAtomicAccessAttributeExp(
        ze_context_handle_t hContext,                   ///< [in] handle of context
        ze_device_handle_t hDevice,                     ///< [in] device associated with the memory advice
        const void* ptr,                                ///< [in] Pointer to the start of the memory range
        size_t size,                                    ///< [in] Size in bytes of the memory range
        ze_memory_atomic_attr_exp_flags_t attr          ///< [in] Atomic access attributes to set for the specified range.
                                                        ///< Must be 0 (default) or a valid combination of ::ze_memory_atomic_attr_exp_flag_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetAtomicAccessAttributeExp = context.zeDdiTable.MemExp.pfnSetAtomicAccessAttributeExp;
        if( nullptr != pfnSetAtomicAccessAttributeExp )
        {
            result = pfnSetAtomicAccessAttributeExp( hContext, hDevice, ptr, size, attr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }